

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

bool __thiscall flatbuffers::cpp::CppGenerator::generate(CppGenerator *this)

{
  CodeWriter *this_00;
  IDLOptionsCpp *opts;
  Namespace *name_space;
  pointer ppSVar1;
  pointer ppSVar2;
  StructDef *pSVar3;
  pointer ppEVar4;
  EnumDef *pEVar5;
  __type _Var6;
  bool bVar7;
  char *pcVar8;
  Parser *pPVar9;
  StructDef **struct_def;
  pointer ppEVar10;
  pointer ppSVar11;
  pointer ppSVar12;
  string *psVar13;
  allocator<char> local_d29;
  string native_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  string file_path;
  string final_code;
  string local_c90;
  string include_guard;
  string cpp_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  MarkIf64BitBuilderIsNeeded(this);
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  pcVar8 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_path,pcVar8,(allocator<char> *)&final_code);
  std::operator+(&include_guard,"// ",&file_path);
  std::operator+(&local_110,&include_guard,"\n\n");
  CodeWriter::operator+=(this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&include_guard);
  std::__cxx11::string::~string((string *)&file_path);
  psVar13 = (this->super_BaseGenerator).file_name_;
  name_space = ((this->super_BaseGenerator).parser_)->current_namespace_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_path,"",(allocator<char> *)&final_code);
  GenIncludeGuard(&include_guard,psVar13,name_space,&file_path);
  std::__cxx11::string::~string((string *)&file_path);
  std::operator+(&local_130,"#ifndef ",&include_guard);
  CodeWriter::operator+=(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::operator+(&local_150,"#define ",&include_guard);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"",(allocator<char> *)&file_path);
  CodeWriter::operator+=(this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  if ((this->opts_).super_IDLOptions.gen_nullable == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"#pragma clang system_header\n\n",(allocator<char> *)&file_path)
    ;
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"#include \"flatbuffers/flatbuffers.h\"",
             (allocator<char> *)&file_path);
  CodeWriter::operator+=(this_00,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (((this->super_BaseGenerator).parser_)->uses_flexbuffers_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"#include \"flatbuffers/flexbuffers.h\"",
               (allocator<char> *)&file_path);
    CodeWriter::operator+=(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"#include \"flatbuffers/flex_flat_util.h\"",
               (allocator<char> *)&file_path);
    CodeWriter::operator+=(this_00,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"",(allocator<char> *)&file_path);
  CodeWriter::operator+=(this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  GenFlatbuffersVersionCheck(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"",(allocator<char> *)&file_path);
  CodeWriter::operator+=(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  if ((this->opts_).super_IDLOptions.include_dependence_headers == true) {
    GenIncludeDependencies(this);
  }
  GenExtraIncludes(this);
  GenEmbeddedIncludes(this);
  if (this->cur_name_space_ != (Namespace *)0x0) {
    __assert_fail("!cur_name_space_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0x1c9,"virtual bool flatbuffers::cpp::CppGenerator::generate()");
  }
  opts = &this->opts_;
  pPVar9 = (this->super_BaseGenerator).parser_;
  ppSVar1 = (pPVar9->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar11 = (pPVar9->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
      ppSVar11 = ppSVar11 + 1) {
    if (((*ppSVar11)->super_Definition).generated == false) {
      SetNameSpace(this,((*ppSVar11)->super_Definition).defined_namespace);
      EscapeKeyword(&final_code,this,(string *)*ppSVar11);
      std::operator+(&file_path,"struct ",&final_code);
      std::operator+(&local_50,&file_path,";");
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&file_path);
      std::__cxx11::string::~string((string *)&final_code);
      if ((*ppSVar11)->fixed == false) {
        EscapeKeyword(&final_code,this,(string *)*ppSVar11);
        std::operator+(&file_path,"struct ",&final_code);
        std::operator+(&local_70,&file_path,"Builder;");
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&file_path);
        std::__cxx11::string::~string((string *)&final_code);
      }
      if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
        EscapeKeyword(&final_code,this,(string *)*ppSVar11);
        NativeName(&file_path,&final_code,*ppSVar11,&opts->super_IDLOptions);
        std::__cxx11::string::~string((string *)&final_code);
        pPVar9 = (this->super_BaseGenerator).parser_;
        ppSVar2 = (pPVar9->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppSVar12 = (pPVar9->structs_).vec.
                        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppSVar12 != ppSVar2;
            ppSVar12 = ppSVar12 + 1) {
          pSVar3 = *ppSVar12;
          if ((pSVar3 != *ppSVar11) &&
             ((pSVar3->super_Definition).defined_namespace ==
              ((*ppSVar11)->super_Definition).defined_namespace)) {
            EscapeKeyword(&final_code,this,(string *)pSVar3);
            _Var6 = std::operator==(&file_path,&final_code);
            if (_Var6) {
              EscapeKeyword(&local_c90,this,(string *)*ppSVar11);
              std::operator+(&local_d08,"Generated Object API type for ",&local_c90);
              std::operator+(&native_name,&local_d08," collides with ");
              std::operator+(&cpp_name,&native_name,&final_code);
              LogCompilerError(&cpp_name);
              std::__cxx11::string::~string((string *)&cpp_name);
              std::__cxx11::string::~string((string *)&native_name);
              std::__cxx11::string::~string((string *)&local_d08);
              std::__cxx11::string::~string((string *)&local_c90);
            }
            std::__cxx11::string::~string((string *)&final_code);
          }
        }
        if ((*ppSVar11)->fixed == false) {
          std::operator+(&final_code,"struct ",&file_path);
          std::operator+(&local_90,&final_code,";");
          CodeWriter::operator+=(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&final_code);
        }
        std::__cxx11::string::~string((string *)&file_path);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"",(allocator<char> *)&file_path);
      CodeWriter::operator+=(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  if (((this->opts_).super_IDLOptions.generate_object_based_api != false) &&
     ((this->opts_).super_IDLOptions.gen_compare == true)) {
    pPVar9 = (this->super_BaseGenerator).parser_;
    ppSVar1 = (pPVar9->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar11 = (pPVar9->structs_).vec.
                    super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
        ppSVar11 = ppSVar11 + 1) {
      if (((*ppSVar11)->super_Definition).generated == false) {
        SetNameSpace(this,((*ppSVar11)->super_Definition).defined_namespace);
        EscapeKeyword(&final_code,this,(string *)*ppSVar11);
        NativeName(&file_path,&final_code,*ppSVar11,&opts->super_IDLOptions);
        std::__cxx11::string::~string((string *)&final_code);
        std::operator+(&native_name,"bool operator==(const ",&file_path);
        std::operator+(&cpp_name,&native_name," &lhs, const ");
        std::operator+(&final_code,&cpp_name,&file_path);
        std::operator+(&local_d0,&final_code," &rhs);");
        CodeWriter::operator+=(this_00,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&final_code);
        std::__cxx11::string::~string((string *)&cpp_name);
        std::__cxx11::string::~string((string *)&native_name);
        std::operator+(&native_name,"bool operator!=(const ",&file_path);
        std::operator+(&cpp_name,&native_name," &lhs, const ");
        std::operator+(&final_code,&cpp_name,&file_path);
        std::operator+(&local_f0,&final_code," &rhs);");
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&final_code);
        std::__cxx11::string::~string((string *)&cpp_name);
        std::__cxx11::string::~string((string *)&native_name);
        std::__cxx11::string::~string((string *)&file_path);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"",(allocator<char> *)&file_path);
    CodeWriter::operator+=(this_00,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
    ppSVar1 = (pPVar9->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar11 = (pPVar9->structs_).vec.
                    super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
        ppSVar11 = ppSVar11 + 1) {
      if (((*ppSVar11)->super_Definition).generated == false) {
        SetNameSpace(this,((*ppSVar11)->super_Definition).defined_namespace);
        GenMiniReflectPre(this,*ppSVar11);
      }
    }
    pPVar9 = (this->super_BaseGenerator).parser_;
  }
  ppEVar4 = (pPVar9->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar10 = (pPVar9->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar10 != ppEVar4;
      ppEVar10 = ppEVar10 + 1) {
    if (((*ppEVar10)->super_Definition).generated == false) {
      SetNameSpace(this,((*ppEVar10)->super_Definition).defined_namespace);
      GenEnum(this,*ppEVar10);
    }
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  ppSVar1 = (pPVar9->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar11 = (pPVar9->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
      ppSVar11 = ppSVar11 + 1) {
    pSVar3 = *ppSVar11;
    if ((pSVar3->fixed == true) && ((pSVar3->super_Definition).generated == false)) {
      SetNameSpace(this,(pSVar3->super_Definition).defined_namespace);
      GenStruct(this,*ppSVar11);
    }
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  ppSVar1 = (pPVar9->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar11 = (pPVar9->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
      ppSVar11 = ppSVar11 + 1) {
    pSVar3 = *ppSVar11;
    if ((pSVar3->fixed == false) && ((pSVar3->super_Definition).generated == false)) {
      SetNameSpace(this,(pSVar3->super_Definition).defined_namespace);
      GenTable(this,*ppSVar11);
    }
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  ppSVar1 = (pPVar9->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar11 = (pPVar9->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
      ppSVar11 = ppSVar11 + 1) {
    pSVar3 = *ppSVar11;
    if ((pSVar3->fixed == false) && ((pSVar3->super_Definition).generated == false)) {
      SetNameSpace(this,(pSVar3->super_Definition).defined_namespace);
      GenTablePost(this,*ppSVar11);
    }
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  ppEVar4 = (pPVar9->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar10 = (pPVar9->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar10 != ppEVar4;
      ppEVar10 = ppEVar10 + 1) {
    pEVar5 = *ppEVar10;
    if ((pEVar5->is_union == true) && ((pEVar5->super_Definition).generated == false)) {
      SetNameSpace(this,(pEVar5->super_Definition).defined_namespace);
      GenUnionPost(this,*ppEVar10);
    }
  }
  pPVar9 = (this->super_BaseGenerator).parser_;
  if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
    ppEVar4 = (pPVar9->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar10 = (pPVar9->enums_).vec.
                    super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppEVar10 != ppEVar4;
        ppEVar10 = ppEVar10 + 1) {
      if (((*ppEVar10)->super_Definition).generated == false) {
        SetNameSpace(this,((*ppEVar10)->super_Definition).defined_namespace);
        GenMiniReflect(this,(StructDef *)0x0,*ppEVar10);
      }
    }
    pPVar9 = (this->super_BaseGenerator).parser_;
    ppSVar1 = (pPVar9->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar11 = (pPVar9->structs_).vec.
                    super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
        ppSVar11 = ppSVar11 + 1) {
      if (((*ppSVar11)->super_Definition).generated == false) {
        SetNameSpace(this,((*ppSVar11)->super_Definition).defined_namespace);
        GenMiniReflect(this,*ppSVar11,(EnumDef *)0x0);
      }
    }
    pPVar9 = (this->super_BaseGenerator).parser_;
  }
  pSVar3 = pPVar9->root_struct_def_;
  if (pSVar3 == (StructDef *)0x0) goto LAB_00150efb;
  SetNameSpace(this,(pSVar3->super_Definition).defined_namespace);
  EscapeKeyword(&file_path,this,(string *)pSVar3);
  Namespace::GetFullyQualifiedName(&final_code,this->cur_name_space_,&file_path,1000);
  TranslateNameSpace(&cpp_name,&final_code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&native_name,"STRUCT_NAME",(allocator<char> *)&local_d08);
  CodeWriter::SetValue(this_00,&native_name,&file_path);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&native_name,"CPP_NAME",(allocator<char> *)&local_d08);
  CodeWriter::SetValue(this_00,&native_name,&cpp_name);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&native_name,"NULLABLE_EXT",(allocator<char> *)&local_c90);
  NullableExtension_abi_cxx11_(&local_d08,this);
  CodeWriter::SetValue(this_00,&native_name,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&native_name,"SIZE_T",(allocator<char> *)&local_c90);
  pcVar8 = "";
  if (this->needs_64_bit_builder_ != false) {
    pcVar8 = ",::flatbuffers::uoffset64_t";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,pcVar8,&local_d29);
  CodeWriter::SetValue(this_00,&native_name,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"inline \\",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void *buf) {",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"inline \\",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,
             "const {{CPP_NAME}} *{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void *buf) {"
             ,(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,
             "  return ::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  if ((this->opts_).super_IDLOptions.mutable_buffer == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"inline \\",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"inline \\",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,
               "{{CPP_NAME}} *{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void *buf) {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,
               "  return ::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
  }
  if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
LAB_001503de:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&native_name,"ID",(allocator<char> *)&local_c90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"nullptr",&local_d29);
    CodeWriter::SetValue(this_00,&native_name,&local_d08);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"inline const char *{{STRUCT_NAME}}Identifier() {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::operator+(&native_name,"  return \"",
                   &((this->super_BaseGenerator).parser_)->file_identifier_);
    std::operator+(&local_510,&native_name,"\";");
    CodeWriter::operator+=(this_00,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&native_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"inline \\",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b0,"  return ::flatbuffers::BufferHasIdentifier(",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_5b0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"      buf, {{STRUCT_NAME}}Identifier());",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f0,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_5f0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_610,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"inline \\",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,
               "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_650);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"  return ::flatbuffers::BufferHasIdentifier(",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,"      buf, {{STRUCT_NAME}}Identifier(), true);",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0)
    goto LAB_001503de;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&native_name,"ID",(allocator<char> *)&local_c90);
    std::operator+(&local_d08,&file_path,"Identifier()");
    CodeWriter::SetValue(this_00,&native_name,&local_d08);
  }
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"inline bool Verify{{STRUCT_NAME}}Buffer(",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"    ::flatbuffers::Verifier &verifier) {",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"    ::flatbuffers::Verifier &verifier) {",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,
             "  return verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  if ((((this->super_BaseGenerator).parser_)->file_extension_)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_830,"inline const char *{{STRUCT_NAME}}Extension() {",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_830);
    std::__cxx11::string::~string((string *)&local_830);
    std::operator+(&native_name,"  return \"",
                   &((this->super_BaseGenerator).parser_)->file_extension_);
    std::operator+(&local_850,&native_name,"\";");
    CodeWriter::operator+=(this_00,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&native_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"}",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_890);
    std::__cxx11::string::~string((string *)&local_890);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"inline void Finish{{STRUCT_NAME}}Buffer(",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  GetBuilder_abi_cxx11_(&local_d08,this);
  std::operator+(&native_name,"    ",&local_d08);
  std::operator+(&local_8d0,&native_name," &fbb,");
  CodeWriter::operator+=(this_00,&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"  fbb.Finish(root);",(allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_930);
    psVar13 = &local_930;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_910,"  fbb.Finish(root, {{STRUCT_NAME}}Identifier());",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_910);
    psVar13 = &local_910;
  }
  std::__cxx11::string::~string((string *)psVar13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_970,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  GetBuilder_abi_cxx11_(&local_d08,this);
  std::operator+(&native_name,"    ",&local_d08);
  std::operator+(&local_9b0,&native_name," &fbb,");
  CodeWriter::operator+=(this_00,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&native_name);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {",
             (allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"  fbb.FinishSizePrefixed(root);",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_a10);
    psVar13 = &local_a10;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,"  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());",
               (allocator<char> *)&native_name);
    CodeWriter::operator+=(this_00,&local_9f0);
    psVar13 = &local_9f0;
  }
  std::__cxx11::string::~string((string *)psVar13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,"}",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_a30);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a50,"",(allocator<char> *)&native_name);
  CodeWriter::operator+=(this_00,&local_a50);
  std::__cxx11::string::~string((string *)&local_a50);
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    WrapNativeNameInNameSpace_abi_cxx11_(&native_name,this,pSVar3,&opts->super_IDLOptions);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d08,"UNPACK_RETURN",&local_d29);
    GenTypeNativePtr(&local_c90,this,&native_name,(FieldDef *)0x0,false);
    CodeWriter::SetValue(this_00,&local_d08,&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_d08);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d08,"UNPACK_TYPE",&local_d29);
    GenTypeNativePtr(&local_c90,this,&native_name,(FieldDef *)0x0,true);
    CodeWriter::SetValue(this_00,&local_d08,&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_d08);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(",
               (allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_a70);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"    const void *buf,",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"    const ::flatbuffers::resolver_function_t *res = nullptr) {"
               ,(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_ab0);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad0,"  return {{UNPACK_TYPE}}\\",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"(Get{{STRUCT_NAME}}(buf)->UnPack(res));",
               (allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_af0);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b10,"}",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b30,"",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_b30);
    std::__cxx11::string::~string((string *)&local_b30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b50,"inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(",
               (allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,"    const void *buf,",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b90,"    const ::flatbuffers::resolver_function_t *res = nullptr) {"
               ,(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_b90);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"  return {{UNPACK_TYPE}}\\",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));",
               (allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_bd0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bf0,"}",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c10,"",(allocator<char> *)&local_d08);
    CodeWriter::operator+=(this_00,&local_c10);
    std::__cxx11::string::~string((string *)&local_c10);
    std::__cxx11::string::~string((string *)&native_name);
  }
  std::__cxx11::string::~string((string *)&cpp_name);
  std::__cxx11::string::~string((string *)&final_code);
  std::__cxx11::string::~string((string *)&file_path);
LAB_00150efb:
  if (this->cur_name_space_ != (Namespace *)0x0) {
    SetNameSpace(this,(Namespace *)0x0);
  }
  std::operator+(&local_c30,"#endif  // ",&include_guard);
  CodeWriter::operator+=(this_00,&local_c30);
  std::__cxx11::string::~string((string *)&local_c30);
  BaseGenerator::GeneratedFileName
            (&file_path,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
             (this->super_BaseGenerator).file_name_,&opts->super_IDLOptions);
  std::__cxx11::stringbuf::str();
  bVar7 = SaveFile(file_path._M_dataplus._M_p,&final_code,false);
  if (bVar7) {
    bVar7 = true;
    if ((((this->super_BaseGenerator).parser_)->opts).binary_schema_gen_embed == true) {
      bVar7 = generate_bfbs_embed(this);
    }
  }
  else {
    bVar7 = false;
  }
  std::__cxx11::string::~string((string *)&final_code);
  std::__cxx11::string::~string((string *)&file_path);
  std::__cxx11::string::~string((string *)&include_guard);
  return bVar7;
}

Assistant:

bool generate() {
    // Check if we require a 64-bit flatbuffer builder.
    MarkIf64BitBuilderIsNeeded();

    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    const auto include_guard =
        GenIncludeGuard(file_name_, *parser_.current_namespace_);
    code_ += "#ifndef " + include_guard;
    code_ += "#define " + include_guard;
    code_ += "";

    if (opts_.gen_nullable) { code_ += "#pragma clang system_header\n\n"; }

    code_ += "#include \"flatbuffers/flatbuffers.h\"";
    if (parser_.uses_flexbuffers_) {
      code_ += "#include \"flatbuffers/flexbuffers.h\"";
      code_ += "#include \"flatbuffers/flex_flat_util.h\"";
    }
    code_ += "";
    GenFlatbuffersVersionCheck();
    code_ += "";

    if (opts_.include_dependence_headers) { GenIncludeDependencies(); }
    GenExtraIncludes();
    GenEmbeddedIncludes();

    FLATBUFFERS_ASSERT(!cur_name_space_);

    // Generate forward declarations for all structs/tables, since they may
    // have circular references.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        code_ += "struct " + Name(*struct_def) + ";";
        if (!struct_def->fixed) {
          code_ += "struct " + Name(*struct_def) + "Builder;";
        }
        if (opts_.generate_object_based_api) {
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);

          // Check that nativeName doesn't collide the name of another struct.
          for (const auto &other_struct_def : parser_.structs_.vec) {
            if (other_struct_def == struct_def ||
                other_struct_def->defined_namespace !=
                    struct_def->defined_namespace) {
              continue;
            }

            auto other_name = Name(*other_struct_def);
            if (nativeName == other_name) {
              LogCompilerError("Generated Object API type for " +
                               Name(*struct_def) + " collides with " +
                               other_name);
              FLATBUFFERS_ASSERT(true);
            }
          }

          if (!struct_def->fixed) { code_ += "struct " + nativeName + ";"; }
        }
        code_ += "";
      }
    }

    // Generate forward declarations for all equal operators
    if (opts_.generate_object_based_api && opts_.gen_compare) {
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);
          code_ += "bool operator==(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
          code_ += "bool operator!=(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
        }
      }
      code_ += "";
    }

    // Generate preablmle code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // To break cyclic dependencies, first pre-declare all tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflectPre(struct_def);
        }
      }
    }

    // Generate code for all the enum declarations.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (!enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenEnum(*enum_def);
      }
    }

    // Generate code for all structs, then all tables.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenStruct(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTable(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTablePost(*struct_def);
      }
    }

    // Generate code for union verifiers.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (enum_def->is_union && !enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenUnionPost(*enum_def);
      }
    }

    // Generate code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // Then the unions/enums that may refer to them.
      for (const auto &enum_def : parser_.enums_.vec) {
        if (!enum_def->generated) {
          SetNameSpace(enum_def->defined_namespace);
          GenMiniReflect(nullptr, enum_def);
        }
      }
      // Then the full tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflect(struct_def, nullptr);
        }
      }
    }

    // Generate convenient global helper functions:
    if (parser_.root_struct_def_) {
      auto &struct_def = *parser_.root_struct_def_;
      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      auto qualified_name = cur_name_space_->GetFullyQualifiedName(name);
      auto cpp_name = TranslateNameSpace(qualified_name);

      code_.SetValue("STRUCT_NAME", name);
      code_.SetValue("CPP_NAME", cpp_name);
      code_.SetValue("NULLABLE_EXT", NullableExtension());
      code_.SetValue(
          "SIZE_T", needs_64_bit_builder_ ? ",::flatbuffers::uoffset64_t" : "");

      // The root datatype accessor:
      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ += "  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);";
      code_ += "}";
      code_ += "";

      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} "
          "*{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ +=
          "  return "
          "::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);";
      code_ += "}";
      code_ += "";

      if (opts_.mutable_buffer) {
        code_ += "inline \\";
        code_ += "{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {";
        code_ +=
            "  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);";
        code_ += "}";
        code_ += "";

        code_ += "inline \\";
        code_ +=
            "{{CPP_NAME}} "
            "*{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void "
            "*buf) {";
        code_ +=
            "  return "
            "::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>("
            "buf);";
        code_ += "}";
        code_ += "";
      }

      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code_ += "inline const char *{{STRUCT_NAME}}Identifier() {";
        code_ += "  return \"" + parser_.file_identifier_ + "\";";
        code_ += "}";
        code_ += "";

        // Check if a buffer has the identifier.
        code_ += "inline \\";
        code_ += "bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier());";
        code_ += "}";
        code_ += "";

        // Check if a size-prefixed buffer has the identifier.
        code_ += "inline \\";
        code_ +=
            "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void "
            "*buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier(), true);";
        code_ += "}";
        code_ += "";
      }

      // The root verifier.
      if (parser_.file_identifier_.length()) {
        code_.SetValue("ID", name + "Identifier()");
      } else {
        code_.SetValue("ID", "nullptr");
      }

      code_ += "inline bool Verify{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ += "  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});";
      code_ += "}";
      code_ += "";

      code_ += "inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ +=
          "  return "
          "verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});";
      code_ += "}";
      code_ += "";

      if (parser_.file_extension_.length()) {
        // Return the extension
        code_ += "inline const char *{{STRUCT_NAME}}Extension() {";
        code_ += "  return \"" + parser_.file_extension_ + "\";";
        code_ += "}";
        code_ += "";
      }

      // Finish a buffer with a given root object:
      code_ += "inline void Finish{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.Finish(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.Finish(root);";
      code_ += "}";
      code_ += "";

      code_ += "inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.FinishSizePrefixed(root);";
      code_ += "}";
      code_ += "";

      if (opts_.generate_object_based_api) {
        // A convenient root unpack function.
        auto native_name = WrapNativeNameInNameSpace(struct_def, opts_);
        code_.SetValue("UNPACK_RETURN",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_.SetValue("UNPACK_TYPE",
                       GenTypeNativePtr(native_name, nullptr, true));

        code_ += "inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(Get{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";

        code_ += "inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";
      }
    }

    if (cur_name_space_) SetNameSpace(nullptr);

    // Close the include guard.
    code_ += "#endif  // " + include_guard;

    const auto file_path = GeneratedFileName(path_, file_name_, opts_);
    const auto final_code = code_.ToString();

    // Save the file and optionally generate the binary schema code.
    return SaveFile(file_path.c_str(), final_code, false) &&
           (!parser_.opts.binary_schema_gen_embed || generate_bfbs_embed());
  }